

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O1

void absl::RemoveExtraAsciiWhitespace(Nonnull<std::string_*> str)

{
  size_t sVar1;
  byte *pbVar2;
  pointer pcVar3;
  byte *pbVar4;
  char *in_RDX;
  byte *pbVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  string_view sVar9;
  
  sVar9._M_str = in_RDX;
  sVar9._M_len = (size_t)(str->_M_dataplus)._M_p;
  sVar9 = StripAsciiWhitespace((absl *)str->_M_string_length,sVar9);
  pbVar4 = (byte *)sVar9._M_str;
  sVar1 = sVar9._M_len;
  if (sVar1 == 0) {
    str->_M_string_length = 0;
    pcVar3 = (str->_M_dataplus)._M_p;
  }
  else {
    pbVar5 = (byte *)(str->_M_dataplus)._M_p;
    if (0 < (long)sVar1) {
      pbVar2 = pbVar4 + sVar1;
      bVar7 = 0;
      do {
        bVar8 = ((&ascii_internal::kPropertyBits)[*pbVar4] & 8) >> 3;
        pbVar5[-(ulong)(bVar7 & bVar8)] = *pbVar4;
        pbVar5 = pbVar5 + -(ulong)(bVar7 & bVar8) + 1;
        pbVar4 = pbVar4 + 1;
        bVar7 = bVar8;
      } while (pbVar4 < pbVar2);
    }
    pcVar3 = (str->_M_dataplus)._M_p;
    uVar6 = (long)pbVar5 - (long)pcVar3;
    if (str->_M_string_length < uVar6) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
    }
    str->_M_string_length = uVar6;
    pcVar3 = pcVar3 + uVar6;
  }
  *pcVar3 = '\0';
  return;
}

Assistant:

void RemoveExtraAsciiWhitespace(absl::Nonnull<std::string*> str) {
  auto stripped = StripAsciiWhitespace(*str);

  if (stripped.empty()) {
    str->clear();
    return;
  }

  auto input_it = stripped.begin();
  auto input_end = stripped.end();
  auto output_it = &(*str)[0];
  bool is_ws = false;

  for (; input_it < input_end; ++input_it) {
    if (is_ws) {
      // Consecutive whitespace?  Keep only the last.
      is_ws = absl::ascii_isspace(static_cast<unsigned char>(*input_it));
      if (is_ws) --output_it;
    } else {
      is_ws = absl::ascii_isspace(static_cast<unsigned char>(*input_it));
    }

    *output_it = *input_it;
    ++output_it;
  }

  str->erase(static_cast<size_t>(output_it - &(*str)[0]));
}